

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O2

int FN_Up_Field(FORM *form)

{
  short sVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  FIELD *field_on_page;
  FIELD *field;
  short sVar5;
  
  field = form->current;
  sVar1 = field->frow;
  sVar2 = field->fcol;
  do {
    field = Sorted_Previous_Field(field);
    sVar3 = field->frow;
    sVar5 = sVar3;
    if (sVar3 != sVar1) goto LAB_003039f3;
  } while (field->fcol != sVar2);
LAB_00303a15:
  iVar4 = _nc_Set_Current_Field(form,field);
  return iVar4;
LAB_003039f3:
  if (sVar5 != sVar3) goto LAB_00303a0d;
  if (field->fcol <= sVar2) goto LAB_00303a15;
  field = Sorted_Previous_Field(field);
  sVar5 = field->frow;
  goto LAB_003039f3;
LAB_00303a0d:
  field = Sorted_Next_Field(field);
  goto LAB_00303a15;
}

Assistant:

static int FN_Up_Field(FORM * form)
{
  return _nc_Set_Current_Field(form,
                               Upper_Neighbour_Field(form->current));
}